

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O1

Vec_Vec_t * Saig_ManBmcSections(Aig_Man_t *p)

{
  void *pvVar1;
  int *piVar2;
  uint uVar3;
  Vec_Ptr_t *vRoots;
  void **ppvVar4;
  Vec_Vec_t *pVVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  
  Aig_ManIncrementTravId(p);
  p->pConst1->TravId = p->nTravIds;
  vRoots = (Vec_Ptr_t *)malloc(0x10);
  vRoots->nCap = 1000;
  vRoots->nSize = 0;
  ppvVar4 = (void **)malloc(8000);
  vRoots->pArray = ppvVar4;
  if (0 < p->nTruePos) {
    lVar10 = 0;
    do {
      if (p->vCos->nSize <= lVar10) {
LAB_0050ab91:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = p->vCos->pArray[lVar10];
      *(int *)((long)pvVar1 + 0x20) = p->nTravIds;
      uVar8 = vRoots->nSize;
      uVar3 = vRoots->nCap;
      if (uVar8 == uVar3) {
        if ((int)uVar3 < 0x10) {
          if (vRoots->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(vRoots->pArray,0x80);
          }
          iVar9 = 0x10;
        }
        else {
          iVar9 = uVar3 * 2;
          if (iVar9 <= (int)uVar3) goto LAB_0050a94d;
          if (vRoots->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar3 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(vRoots->pArray,(ulong)uVar3 << 4);
          }
        }
        vRoots->pArray = ppvVar4;
        vRoots->nCap = iVar9;
      }
LAB_0050a94d:
      vRoots->nSize = uVar8 + 1;
      vRoots->pArray[(int)uVar8] = pvVar1;
      lVar10 = lVar10 + 1;
    } while (lVar10 < p->nTruePos);
  }
  pVVar5 = (Vec_Vec_t *)malloc(0x10);
  pVVar5->nCap = 0x14;
  pVVar5->nSize = 0;
  ppvVar4 = (void **)malloc(0xa0);
  pVVar5->pArray = ppvVar4;
  uVar8 = vRoots->nSize;
  while (0 < (int)uVar8) {
    pVVar6 = Saig_ManBmcDfsNodes(p,vRoots);
    uVar8 = pVVar5->nSize;
    uVar3 = pVVar5->nCap;
    if (uVar8 == uVar3) {
      if ((int)uVar3 < 0x10) {
        if (pVVar5->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc(0x80);
        }
        else {
          ppvVar4 = (void **)realloc(pVVar5->pArray,0x80);
        }
        iVar9 = 0x10;
      }
      else {
        iVar9 = uVar3 * 2;
        if (iVar9 <= (int)uVar3) goto LAB_0050aa1d;
        if (pVVar5->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc((ulong)uVar3 << 4);
        }
        else {
          ppvVar4 = (void **)realloc(pVVar5->pArray,(ulong)uVar3 << 4);
        }
      }
      pVVar5->pArray = ppvVar4;
      pVVar5->nCap = iVar9;
    }
LAB_0050aa1d:
    pVVar5->nSize = uVar8 + 1;
    pVVar5->pArray[(int)uVar8] = pVVar6;
    vRoots->nSize = 0;
    if (pVVar6->nSize < 1) break;
    lVar10 = 0;
    uVar8 = 0;
    do {
      piVar2 = (int *)pVVar6->pArray[lVar10];
      if ((((uint)*(undefined8 *)(piVar2 + 6) & 7) == 2) && (p->nTruePis <= *piVar2)) {
        if (*piVar2 < p->nTruePis) {
          __assert_fail("Saig_ObjIsLo(p, pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saig.h"
                        ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
        }
        uVar3 = (*piVar2 - p->nTruePis) + p->nTruePos;
        if (((int)uVar3 < 0) || (p->vCos->nSize <= (int)uVar3)) goto LAB_0050ab91;
        pvVar1 = p->vCos->pArray[uVar3];
        if (*(int *)((long)pvVar1 + 0x20) != p->nTravIds) {
          *(int *)((long)pvVar1 + 0x20) = p->nTravIds;
          uVar3 = vRoots->nCap;
          if (uVar8 == uVar3) {
            if ((int)uVar3 < 0x10) {
              if (vRoots->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(0x80);
              }
              else {
                ppvVar4 = (void **)realloc(vRoots->pArray,0x80);
              }
              iVar9 = 0x10;
            }
            else {
              iVar9 = uVar3 * 2;
              if (iVar9 <= (int)uVar3) goto LAB_0050ab10;
              if (vRoots->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc((ulong)uVar3 << 4);
              }
              else {
                ppvVar4 = (void **)realloc(vRoots->pArray,(ulong)uVar3 << 4);
              }
            }
            vRoots->pArray = ppvVar4;
            vRoots->nCap = iVar9;
          }
LAB_0050ab10:
          lVar7 = (long)(int)uVar8;
          uVar8 = uVar8 + 1;
          vRoots->nSize = uVar8;
          vRoots->pArray[lVar7] = pvVar1;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar6->nSize);
  }
  if (vRoots->pArray != (void **)0x0) {
    free(vRoots->pArray);
    vRoots->pArray = (void **)0x0;
  }
  free(vRoots);
  return pVVar5;
}

Assistant:

Vec_Vec_t * Saig_ManBmcSections( Aig_Man_t * p )
{
    Vec_Ptr_t * vSects, * vRoots, * vCone;
    Aig_Obj_t * pObj, * pObjPo;
    int i;
    Aig_ManIncrementTravId( p );
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    // start the roots
    vRoots = Vec_PtrAlloc( 1000 );
    Saig_ManForEachPo( p, pObjPo, i )
    {
        Aig_ObjSetTravIdCurrent( p, pObjPo );
        Vec_PtrPush( vRoots, pObjPo );
    }
    // compute the cones
    vSects = Vec_PtrAlloc( 20 );
    while ( Vec_PtrSize(vRoots) > 0 )
    {
        vCone = Saig_ManBmcDfsNodes( p, vRoots );
        Vec_PtrPush( vSects, vCone );
        // get the next set of roots
        Vec_PtrClear( vRoots );
        Vec_PtrForEachEntry( Aig_Obj_t *, vCone, pObj, i )
        {
            if ( !Saig_ObjIsLo(p, pObj) )
                continue;
            pObjPo = Saig_ObjLoToLi( p, pObj );
            if ( Aig_ObjIsTravIdCurrent(p, pObjPo) )
                continue;
            Aig_ObjSetTravIdCurrent( p, pObjPo );
            Vec_PtrPush( vRoots, pObjPo );
        }
    }
    Vec_PtrFree( vRoots );
    return (Vec_Vec_t *)vSects;
}